

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Model * gvr::loadModel(char *name,char *spath,bool verbose,bool merge_double_vertices)

{
  long lVar1;
  long lVar2;
  byte in_CL;
  byte in_DL;
  char *in_RDI;
  string s;
  undefined1 in_stack_000005cf;
  char *in_stack_000005d0;
  undefined1 in_stack_000006c7;
  char *in_stack_000006c8;
  char *in_stack_000006d0;
  char *in_stack_00000890;
  allocator local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  Model *local_8;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RDI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  lVar1 = std::__cxx11::string::rfind((char *)local_40,0x1db546);
  lVar2 = std::__cxx11::string::size();
  if (lVar1 != lVar2 + -4) {
    lVar1 = std::__cxx11::string::rfind((char *)local_40,0x1db54b);
    lVar2 = std::__cxx11::string::size();
    if (lVar1 != lVar2 + -4) {
      lVar1 = std::__cxx11::string::rfind((char *)local_40,0x1dbc58);
      lVar2 = std::__cxx11::string::size();
      if (lVar1 != lVar2 + -4) {
        lVar1 = std::__cxx11::string::rfind((char *)local_40,0x1dbc5d);
        lVar2 = std::__cxx11::string::size();
        if (lVar1 != lVar2 + -4) {
          local_8 = loadDepth(in_stack_000006d0,in_stack_000006c8,(bool)in_stack_000006c7);
          goto LAB_0014f13e;
        }
      }
      local_8 = loadPLY(in_stack_00000890);
      goto LAB_0014f13e;
    }
  }
  local_8 = loadSTL(in_stack_000005d0,(bool)in_stack_000005cf);
LAB_0014f13e:
  std::__cxx11::string::~string(local_40);
  return local_8;
}

Assistant:

Model *loadModel(const char *name, const char *spath, bool verbose, bool merge_double_vertices)
{
  std::string s=name;

  if (s.rfind(".stl") == s.size()-4 || s.rfind(".STL") == s.size()-4)
  {
    return loadSTL(name, merge_double_vertices);
  }
  else if (s.rfind(".ply") == s.size()-4 || s.rfind(".PLY") == s.size()-4)
  {
    return loadPLY(name);
  }

  return loadDepth(name, spath, verbose);
}